

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBatchCopyToFile::GetGlobalSinkState
          (PhysicalBatchCopyToFile *this,ClientContext *context)

{
  pointer pLVar1;
  pointer pLVar2;
  code *pcVar3;
  const_reference pvVar4;
  FixedBatchCopyGlobalState *this_00;
  pointer pFVar5;
  idx_t iVar6;
  ClientContext *in_RDX;
  _Head_base<0UL,_duckdb::FixedBatchCopyGlobalState_*,_false> local_30;
  
  pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)&context->db
                      ,0);
  pLVar1 = (pvVar4->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar2 = (pvVar4->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (FixedBatchCopyGlobalState *)operator_new(0x240);
  FixedBatchCopyGlobalState::FixedBatchCopyGlobalState
            (this_00,in_RDX,((ulong)((long)pLVar1 - (long)pLVar2) >> 3) * -0x5555555555400000);
  local_30._M_head_impl = this_00;
  if (context[1].config.field_0x92 == '\x01') {
    pFVar5 = unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
             ::operator->((unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
                           *)&local_30);
    FixedBatchCopyGlobalState::Initialize(pFVar5,in_RDX,(PhysicalBatchCopyToFile *)context);
  }
  pcVar3 = (code *)(context->config).streaming_buffer_size;
  if (pcVar3 == (code *)0x0) {
    iVar6 = 0;
  }
  else {
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator*
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               &context[1].config.profiler_settings._M_h._M_rehash_policy);
    iVar6 = (*pcVar3)();
  }
  pFVar5 = unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::FixedBatchCopyGlobalState,_std::default_delete<duckdb::FixedBatchCopyGlobalState>,_true>
                         *)&local_30);
  pFVar5->batch_size = iVar6;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBatchCopyToFile::GetGlobalSinkState(ClientContext &context) const {
	// request memory based on the minimum amount of memory per column
	auto minimum_memory_per_thread =
	    FixedBatchCopyGlobalState::MINIMUM_MEMORY_PER_COLUMN_PER_THREAD * children[0].get().GetTypes().size();
	auto result = make_uniq<FixedBatchCopyGlobalState>(context, minimum_memory_per_thread);
	if (write_empty_file) {
		// if we are writing the file also if it is empty - initialize now
		result->Initialize(context, *this);
	}
	result->batch_size = function.desired_batch_size ? function.desired_batch_size(context, *bind_data) : 0;
	return std::move(result);
}